

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_str.c
# Opt level: O1

char * error_str(int i)

{
  if (i == 0) {
    return "no error";
  }
  if (error_intr == i) {
    return "interrupted system call";
  }
  if (error_nomem == i) {
    return "out of memory";
  }
  if (error_noent == i) {
    return "file does not exist";
  }
  if (error_txtbsy == i) {
    return "text busy";
  }
  if (error_io == i) {
    return "input/output error";
  }
  if (error_exist == i) {
    return "file already exists";
  }
  if (error_timeout == i) {
    return "timed out";
  }
  if (error_inprogress == i) {
    return "operation in progress";
  }
  if (error_again == i) {
    return "temporary failure";
  }
  if (error_wouldblock == i) {
    return "input/output would block";
  }
  if (error_pipe == i) {
    return "broken pipe";
  }
  if (error_perm == i) {
    return "permission denied";
  }
  if (error_acces == i) {
    return "access denied";
  }
  if (error_nodevice == i) {
    return "device not configured";
  }
  if (error_proto == i) {
    return "protocol error";
  }
  if (error_isdir == i) {
    return "is a directory";
  }
  if (error_connrefused == i) {
    return "connection refused";
  }
  if (error_notdir == i) {
    return "not a directory";
  }
  switch(i) {
  case 3:
    return "no such process";
  case 7:
    return "argument list too long";
  case 8:
    return "exec format error";
  case 9:
    return "file descriptor not open";
  case 10:
    return "no child processes";
  case 0xe:
    return "bad address";
  case 0xf:
    return "not a block device";
  case 0x10:
    return "device busy";
  case 0x12:
    return "cross-device link";
  case 0x13:
    return "device does not support operation";
  case 0x16:
    return "invalid argument";
  case 0x17:
    return "system cannot open more files";
  case 0x18:
    return "process cannot open more files";
  case 0x19:
    return "not a tty";
  case 0x1b:
    return "file too big";
  case 0x1c:
    return "out of disk space";
  case 0x1d:
    return "unseekable descriptor";
  case 0x1e:
    return "read-only file system";
  case 0x1f:
    return "too many links";
  case 0x21:
    return "input out of range";
  case 0x22:
    return "output out of range";
  case 0x23:
    return "operation would cause deadlock";
  case 0x24:
    return "file name too long";
  case 0x25:
    return "no locks available";
  case 0x26:
    return "system call not available";
  case 0x27:
    return "directory not empty";
  case 0x28:
    return "symbolic link loop";
  case 0x2a:
    return "no message of desired type";
  case 0x2b:
    return "identifier removed";
  case 0x3c:
    return "not a stream device";
  case 0x3e:
    return "timer expired";
  case 0x3f:
    return "out of stream resources";
  case 0x40:
    return "machine not on network";
  case 0x42:
    return "too many levels of remote in path";
  case 0x43:
    return "link severed";
  case 0x4a:
    return "bad message type";
  case 0x57:
    return "too many users";
  case 0x58:
    return "not a socket";
  case 0x59:
    return "destination address required";
  case 0x5a:
    return "message too long";
  case 0x5b:
    return "incorrect protocol type";
  case 0x5c:
    return "protocol not available";
  case 0x5d:
    return "protocol not supported";
  case 0x5e:
    return "socket type not supported";
  case 0x5f:
    return "operation not supported";
  case 0x60:
    return "protocol family not supported";
  case 0x61:
    return "address family not supported";
  case 0x62:
    return "address already used";
  case 99:
    return "address not available";
  case 100:
    return "network down";
  case 0x65:
    return "network unreachable";
  case 0x66:
    return "network reset";
  case 0x67:
    return "connection aborted";
  case 0x68:
    return "connection reset";
  case 0x69:
    return "out of buffer space";
  case 0x6a:
    return "already connected";
  case 0x6b:
    return "not connected";
  case 0x6c:
    return "socket shut down";
  case 0x6d:
    return "too many references";
  case 0x70:
    return "host down";
  case 0x71:
    return "host unreachable";
  case 0x72:
    return "operation already in progress";
  case 0x74:
    return "stale NFS file handle";
  case 0x7a:
    return "disk quota exceeded";
  }
  if (i - 0x44U < 0xb) {
    return &DAT_00105838 + *(int *)(&DAT_00105838 + (ulong)(i - 0x44U) * 4);
  }
  return "unknown error";
}

Assistant:

const char *error_str(int i)
{
  X(0,"no error")
  X(error_intr,"interrupted system call")
  X(error_nomem,"out of memory")
  X(error_noent,"file does not exist")
  X(error_txtbsy,"text busy")
  X(error_io,"input/output error")
  X(error_exist,"file already exists")
  X(error_timeout,"timed out")
  X(error_inprogress,"operation in progress")
  X(error_again,"temporary failure")
  X(error_wouldblock,"input/output would block")
  X(error_pipe,"broken pipe")
  X(error_perm,"permission denied")
  X(error_acces,"access denied")
  X(error_nodevice,"device not configured")
  X(error_proto,"protocol error")
  X(error_isdir,"is a directory")
  X(error_connrefused,"connection refused")
  X(error_notdir,"not a directory")
#ifdef ESRCH
  X(ESRCH,"no such process")
#endif
#ifdef E2BIG
  X(E2BIG,"argument list too long")
#endif
#ifdef ENOEXEC
  X(ENOEXEC,"exec format error")
#endif
#ifdef EBADF
  X(EBADF,"file descriptor not open")
#endif
#ifdef ECHILD
  X(ECHILD,"no child processes")
#endif
#ifdef EDEADLK
  X(EDEADLK,"operation would cause deadlock")
#endif
#ifdef EFAULT
  X(EFAULT,"bad address")
#endif
#ifdef ENOTBLK
  X(ENOTBLK,"not a block device")
#endif
#ifdef EBUSY
  X(EBUSY,"device busy")
#endif
#ifdef EXDEV
  X(EXDEV,"cross-device link")
#endif
#ifdef ENODEV
  X(ENODEV,"device does not support operation")
#endif
#ifdef EINVAL
  X(EINVAL,"invalid argument")
#endif
#ifdef ENFILE
  X(ENFILE,"system cannot open more files")
#endif
#ifdef EMFILE
  X(EMFILE,"process cannot open more files")
#endif
#ifdef ENOTTY
  X(ENOTTY,"not a tty")
#endif
#ifdef EFBIG
  X(EFBIG,"file too big")
#endif
#ifdef ENOSPC
  X(ENOSPC,"out of disk space")
#endif
#ifdef ESPIPE
  X(ESPIPE,"unseekable descriptor")
#endif
#ifdef EROFS
  X(EROFS,"read-only file system")
#endif
#ifdef EMLINK
  X(EMLINK,"too many links")
#endif
#ifdef EDOM
  X(EDOM,"input out of range")
#endif
#ifdef ERANGE
  X(ERANGE,"output out of range")
#endif
#ifdef EALREADY
  X(EALREADY,"operation already in progress")
#endif
#ifdef ENOTSOCK
  X(ENOTSOCK,"not a socket")
#endif
#ifdef EDESTADDRREQ
  X(EDESTADDRREQ,"destination address required")
#endif
#ifdef EMSGSIZE
  X(EMSGSIZE,"message too long")
#endif
#ifdef EPROTOTYPE
  X(EPROTOTYPE,"incorrect protocol type")
#endif
#ifdef ENOPROTOOPT
  X(ENOPROTOOPT,"protocol not available")
#endif
#ifdef EPROTONOSUPPORT
  X(EPROTONOSUPPORT,"protocol not supported")
#endif
#ifdef ESOCKTNOSUPPORT
  X(ESOCKTNOSUPPORT,"socket type not supported")
#endif
#ifdef EOPNOTSUPP
  X(EOPNOTSUPP,"operation not supported")
#endif
#ifdef EPFNOSUPPORT
  X(EPFNOSUPPORT,"protocol family not supported")
#endif
#ifdef EAFNOSUPPORT
  X(EAFNOSUPPORT,"address family not supported")
#endif
#ifdef EADDRINUSE
  X(EADDRINUSE,"address already used")
#endif
#ifdef EADDRNOTAVAIL
  X(EADDRNOTAVAIL,"address not available")
#endif
#ifdef ENETDOWN
  X(ENETDOWN,"network down")
#endif
#ifdef ENETUNREACH
  X(ENETUNREACH,"network unreachable")
#endif
#ifdef ENETRESET
  X(ENETRESET,"network reset")
#endif
#ifdef ECONNABORTED
  X(ECONNABORTED,"connection aborted")
#endif
#ifdef ECONNRESET
  X(ECONNRESET,"connection reset")
#endif
#ifdef ENOBUFS
  X(ENOBUFS,"out of buffer space")
#endif
#ifdef EISCONN
  X(EISCONN,"already connected")
#endif
#ifdef ENOTCONN
  X(ENOTCONN,"not connected")
#endif
#ifdef ESHUTDOWN
  X(ESHUTDOWN,"socket shut down")
#endif
#ifdef ETOOMANYREFS
  X(ETOOMANYREFS,"too many references")
#endif
#ifdef ELOOP
  X(ELOOP,"symbolic link loop")
#endif
#ifdef ENAMETOOLONG
  X(ENAMETOOLONG,"file name too long")
#endif
#ifdef EHOSTDOWN
  X(EHOSTDOWN,"host down")
#endif
#ifdef EHOSTUNREACH
  X(EHOSTUNREACH,"host unreachable")
#endif
#ifdef ENOTEMPTY
  X(ENOTEMPTY,"directory not empty")
#endif
#ifdef EPROCLIM
  X(EPROCLIM,"too many processes")
#endif
#ifdef EUSERS
  X(EUSERS,"too many users")
#endif
#ifdef EDQUOT
  X(EDQUOT,"disk quota exceeded")
#endif
#ifdef ESTALE
  X(ESTALE,"stale NFS file handle")
#endif
#ifdef EREMOTE
  X(EREMOTE,"too many levels of remote in path")
#endif
#ifdef EBADRPC
  X(EBADRPC,"RPC structure is bad")
#endif
#ifdef ERPCMISMATCH
  X(ERPCMISMATCH,"RPC version mismatch")
#endif
#ifdef EPROGUNAVAIL
  X(EPROGUNAVAIL,"RPC program unavailable")
#endif
#ifdef EPROGMISMATCH
  X(EPROGMISMATCH,"program version mismatch")
#endif
#ifdef EPROCUNAVAIL
  X(EPROCUNAVAIL,"bad procedure for program")
#endif
#ifdef ENOLCK
  X(ENOLCK,"no locks available")
#endif
#ifdef ENOSYS
  X(ENOSYS,"system call not available")
#endif
#ifdef EFTYPE
  X(EFTYPE,"bad file type")
#endif
#ifdef EAUTH
  X(EAUTH,"authentication error")
#endif
#ifdef ENEEDAUTH
  X(ENEEDAUTH,"not authenticated")
#endif
#ifdef ENOSTR
  X(ENOSTR,"not a stream device")
#endif
#ifdef ETIME
  X(ETIME,"timer expired")
#endif
#ifdef ENOSR
  X(ENOSR,"out of stream resources")
#endif
#ifdef ENOMSG
  X(ENOMSG,"no message of desired type")
#endif
#ifdef EBADMSG
  X(EBADMSG,"bad message type")
#endif
#ifdef EIDRM
  X(EIDRM,"identifier removed")
#endif
#ifdef ENONET
  X(ENONET,"machine not on network")
#endif
#ifdef ERREMOTE
  X(ERREMOTE,"object not local")
#endif
#ifdef ENOLINK
  X(ENOLINK,"link severed")
#endif
#ifdef EADV
  X(EADV,"advertise error")
#endif
#ifdef ESRMNT
  X(ESRMNT,"srmount error")
#endif
#ifdef ECOMM
  X(ECOMM,"communication error")
#endif
#ifdef EMULTIHOP
  X(EMULTIHOP,"multihop attempted")
#endif
#ifdef EREMCHG
  X(EREMCHG,"remote address changed")
#endif
  return "unknown error";
}